

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_ULong FT_Stream_ReadUOffset(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  FT_Stream local_38;
  FT_ULong result;
  FT_Byte *p;
  FT_Error *pFStack_20;
  FT_Byte reads [3];
  FT_Error *error_local;
  FT_Stream stream_local;
  
  local_38 = (FT_Stream)0x0;
  pFStack_20 = error;
  if (stream->pos + 2 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      result = (FT_ULong)(stream->base + stream->pos);
    }
    else {
      uVar1 = (*stream->read)(stream,stream->pos,(uchar *)((long)&p + 5),3);
      if (uVar1 != 3) goto LAB_002e1a3c;
      result = (long)&p + 5;
    }
    if (result != 0) {
      local_38 = (FT_Stream)
                 (ulong)((uint)*(byte *)result << 0x10 | (uint)*(byte *)(result + 1) << 8 |
                        (uint)*(byte *)(result + 2));
    }
    stream->pos = stream->pos + 3;
    *pFStack_20 = 0;
    stream_local = local_38;
  }
  else {
LAB_002e1a3c:
    *pFStack_20 = 0x55;
    stream_local = (FT_Stream)0x0;
  }
  return (FT_ULong)stream_local;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_ReadUOffset( FT_Stream  stream,
                         FT_Error*  error )
  {
    FT_Byte   reads[3];
    FT_Byte*  p;
    FT_ULong  result = 0;


    FT_ASSERT( stream );

    if ( stream->pos + 2 < stream->size )
    {
      if ( stream->read )
      {
        if (stream->read( stream, stream->pos, reads, 3L ) != 3L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_UOFF3( p );
    }
    else
      goto Fail;

    stream->pos += 3;

    *error = FT_Err_Ok;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadUOffset:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return result;
  }